

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool ObjectTemp::IsTempUseOpCodeSym(Instr *instr,OpCode opcode,Sym *sym)

{
  byte bVar1;
  bool bVar2;
  IndirOpnd *pIVar3;
  RegOpnd *pRVar4;
  PropertySym *pPVar5;
  PropertySymOpnd *pPVar6;
  StackSym *pSVar7;
  int iVar8;
  undefined6 in_register_00000032;
  Opnd *this;
  
  iVar8 = (int)CONCAT62(in_register_00000032,opcode);
  if (iVar8 == 0x204) {
    pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_dst);
    if (pIVar3->m_baseOpnd->m_sym == (StackSym *)sym) {
      return true;
    }
LAB_005be4df:
    pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_src1);
    pRVar4 = pIVar3->m_baseOpnd;
LAB_005be4ec:
    pSVar7 = pRVar4->m_sym;
    goto LAB_005be5a8;
  }
  if ((((iVar8 == 0x5e) || (iVar8 == 0x66)) || (iVar8 == 0x68)) || (iVar8 == 0x6c)) {
LAB_005be548:
    this = instr->m_src1;
  }
  else {
    if ((iVar8 != 0x70) && (iVar8 != 0x76)) {
      if (iVar8 != 0x7a) {
        if (iVar8 == 0x97) goto LAB_005be4df;
        if ((iVar8 == 0x9a) || (iVar8 == 0x9c)) {
          pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_dst);
          if (pIVar3->m_baseOpnd->m_sym != (StackSym *)sym) {
            return false;
          }
          pSVar7 = IR::Opnd::GetStackSym(instr->m_src1);
          return pSVar7 != (StackSym *)sym;
        }
        if (iVar8 == 0xa6) {
          bVar2 = IR::Opnd::IsRegOpnd(instr->m_src1);
          if (bVar2) {
            pRVar4 = IR::Opnd::AsRegOpnd(instr->m_src1);
            pSVar7 = IR::Opnd::GetStackSym(&pRVar4->super_Opnd);
            goto LAB_005be5a8;
          }
        }
        else {
          if (iVar8 == 0x1de) {
            return true;
          }
          if (iVar8 != 0x1f5) {
            if (iVar8 != 0x203) {
              if (iVar8 != 0x59) {
                bVar2 = OpCodeAttr::OpndHasImplicitCall(opcode);
                if (bVar2) {
                  return false;
                }
                bVar2 = OpCodeAttr::TempObjectSources(opcode);
                if (!bVar2) {
                  return false;
                }
                bVar2 = OpCodeAttr::TempObjectTransfer(opcode);
                if (!bVar2) {
                  return true;
                }
              }
              return (bool)((instr->field_0x36 & 8) >> 3);
            }
            pIVar3 = IR::Opnd::AsIndirOpnd(instr->m_dst);
            if (pIVar3->m_baseOpnd->m_sym == (StackSym *)sym) {
              return true;
            }
            bVar2 = IR::Opnd::IsRegOpnd(instr->m_src1);
            if (!bVar2) {
              return false;
            }
            pRVar4 = IR::Opnd::AsRegOpnd(instr->m_src1);
            goto LAB_005be4ec;
          }
        }
        goto LAB_005be548;
      }
      pPVar6 = IR::Opnd::AsPropertySymOpnd(instr->m_dst);
      pPVar5 = IR::PropertySymOpnd::GetPropertySym(pPVar6);
      bVar1 = Js::PropertyRecord::DefaultAttributesForPropertyId(pPVar5->m_propertyId,true);
      if ((bVar1 & 8) != 0) {
        return false;
      }
    }
    if (((instr->m_src1 != (Opnd *)0x0) &&
        (pSVar7 = IR::Opnd::GetStackSym(instr->m_src1), pSVar7 == (StackSym *)sym)) ||
       ((instr->m_src2 != (Opnd *)0x0 &&
        (pSVar7 = IR::Opnd::GetStackSym(instr->m_src2), pSVar7 == (StackSym *)sym)))) {
      return false;
    }
    this = instr->m_dst;
  }
  pPVar6 = IR::Opnd::AsPropertySymOpnd(this);
  pSVar7 = IR::PropertySymOpnd::GetObjectSym(pPVar6);
LAB_005be5a8:
  return pSVar7 == (StackSym *)sym;
}

Assistant:

bool
ObjectTemp::IsTempUseOpCodeSym(IR::Instr * instr, Js::OpCode opcode, Sym * sym)
{
    // Special case ArgOut_A which communicate information about CallDirect
    switch (opcode)
    {
    case Js::OpCode::ArgOut_A:
        return instr->dstIsTempObject;
    case Js::OpCode::LdLen_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            return instr->GetSrc1()->AsRegOpnd()->GetStackSym() == sym;
        }
        // fall through
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdMethodFromFlags:
        return instr->GetSrc1()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::InitFld:
        if (Js::PropertyRecord::DefaultAttributesForPropertyId(
                instr->GetDst()->AsPropertySymOpnd()->GetPropertySym()->m_propertyId, true) & PropertyDeleted)
        {
            // If the property record is marked PropertyDeleted, the InitFld will cause a type handler conversion,
            // which may result in creation of a weak reference to the object itself.
            return false;
        }
        // Fall through
    case Js::OpCode::StFld:
    case Js::OpCode::StFldStrict:
        return
            !(instr->GetSrc1() && instr->GetSrc1()->GetStackSym() == sym) &&
            !(instr->GetSrc2() && instr->GetSrc2()->GetStackSym() == sym) &&
            instr->GetDst()->AsPropertySymOpnd()->GetObjectSym() == sym;
    case Js::OpCode::LdElemI_A:
        return instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym && instr->GetSrc1()->GetStackSym() != sym;
    case Js::OpCode::Memset:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym == sym);
    case Js::OpCode::Memcopy:
        return instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym || instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == sym;

    // Special case FromVar for now until we can allow CallsValueOf opcode to be accept temp use
    case Js::OpCode::FromVar:
        return true;
    }

    // TODO: Currently, when we disable implicit call, we still don't allow valueOf/toString that has no side effects
    // So we shouldn't mark them if we have use of the sym on opcode that does OpndHasImplicitCall yet.
    if (OpCodeAttr::OpndHasImplicitCall(opcode))
    {
        return false;
    }

    // Mark the symbol as non-tempable if the instruction doesn't allow temp sources,
    // or it is transferred to a non-temp dst
    return (OpCodeAttr::TempObjectSources(opcode)
        && (!OpCodeAttr::TempObjectTransfer(opcode) || instr->dstIsTempObject));
}